

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O1

bool_t prf_vertex_list_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  bool_t bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_vertex_list_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if ((4 < uVar2) && (node->data == (uint8_t *)0x0)) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar4 = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        puVar4 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = puVar4;
      if (puVar4 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar6 = 4;
        goto LAB_00109b2c;
      }
    }
    uVar1 = node->length;
    bVar5 = 1;
    if (7 < uVar1) {
      puVar4 = node->data;
      iVar8 = uVar1 - 1;
      if (-1 < (int)(uVar1 - 4)) {
        iVar8 = uVar1 - 4;
      }
      uVar6 = iVar8 >> 2;
      if (iVar8 >> 2 < 2) {
        uVar6 = 1;
      }
      uVar7 = 0;
      do {
        uVar3 = bf_get_uint32_be(bfile);
        *(uint32_t *)(puVar4 + uVar7 * 4) = uVar3;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  else {
    prf_error(9,"tried vertex list load method on node of type %d.",(ulong)uVar2);
    uVar6 = 2;
LAB_00109b2c:
    bf_rewind(bfile,uVar6);
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_vertex_list_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int num, count;
    uint32_t * ptr;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex list load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        ptr[num] = bf_get_uint32_be( bfile );
        num++;
    }

    return TRUE;
}